

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O1

bool __thiscall sglr::ReferenceContext::predrawErrorChecks(ReferenceContext *this,deUint32 mode)

{
  GeometryShaderInputType GVar1;
  ShaderProgram *pSVar2;
  int iVar3;
  
  if ((mode < 0xe) && ((0x3c7fU >> (mode & 0x1f) & 1) != 0)) {
    iVar3 = (*(this->super_Context)._vptr_Context[0x21])(this,0x8ca9);
    if (iVar3 == 0x8cd5) {
      if (this->m_currentProgram == (ShaderProgramObjectContainer *)0x0) {
        return true;
      }
      pSVar2 = this->m_currentProgram->m_program;
      if (pSVar2->m_hasGeometryShader != true) {
        return true;
      }
      GVar1 = (pSVar2->super_GeometryShader).m_inputType;
      if (((((mode == 0) || (GVar1 != GEOMETRYSHADERINPUTTYPE_POINTS)) &&
           ((mode == 2 || (((mode & 0xd) == 1 || (GVar1 != GEOMETRYSHADERINPUTTYPE_LINES)))))) &&
          ((0xfffffffc < mode - 7 || (GVar1 != GEOMETRYSHADERINPUTTYPE_TRIANGLES)))) &&
         ((0xfffffffd < mode - 0xc || (GVar1 != GEOMETRYSHADERINPUTTYPE_LINES_ADJACENCY)))) {
        if (0xfffffffd < mode - 0xe) {
          return true;
        }
        if (GVar1 != GEOMETRYSHADERINPUTTYPE_TRIANGLES_ADJACENCY) {
          return true;
        }
      }
      if (this->m_lastError == 0) {
        this->m_lastError = 0x502;
      }
    }
    else if (this->m_lastError == 0) {
      this->m_lastError = 0x506;
    }
  }
  else if (this->m_lastError == 0) {
    this->m_lastError = 0x500;
  }
  return false;
}

Assistant:

bool ReferenceContext::predrawErrorChecks (deUint32 mode)
{
	RC_IF_ERROR(mode != GL_POINTS &&
				mode != GL_LINE_STRIP && mode != GL_LINE_LOOP && mode != GL_LINES &&
				mode != GL_TRIANGLE_STRIP && mode != GL_TRIANGLE_FAN && mode != GL_TRIANGLES &&
				mode != GL_LINES_ADJACENCY && mode != GL_LINE_STRIP_ADJACENCY &&
				mode != GL_TRIANGLES_ADJACENCY && mode != GL_TRIANGLE_STRIP_ADJACENCY,
				GL_INVALID_ENUM, false);

	// \todo [jarkko] Uncomment following code when the buffer mapping support is added
	//for (size_t ndx = 0; ndx < vao.m_arrays.size(); ++ndx)
	//	if (vao.m_arrays[ndx].enabled && vao.m_arrays[ndx].bufferBinding && vao.m_arrays[ndx].bufferBinding->isMapped)
	//		RC_ERROR_RET(GL_INVALID_OPERATION, RC_RET_VOID);

	RC_IF_ERROR(checkFramebufferStatus(GL_DRAW_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE, GL_INVALID_FRAMEBUFFER_OPERATION, false);

	// Geometry shader checks
	if (m_currentProgram && m_currentProgram->m_program->m_hasGeometryShader)
	{
		RC_IF_ERROR(m_currentProgram->m_program->rr::GeometryShader::getInputType() == rr::GEOMETRYSHADERINPUTTYPE_POINTS && mode != GL_POINTS, GL_INVALID_OPERATION, false);

		RC_IF_ERROR(m_currentProgram->m_program->rr::GeometryShader::getInputType() == rr::GEOMETRYSHADERINPUTTYPE_LINES &&
			(mode != GL_LINES &&
			 mode != GL_LINE_STRIP &&
			 mode != GL_LINE_LOOP),
			 GL_INVALID_OPERATION, false);

		RC_IF_ERROR(m_currentProgram->m_program->rr::GeometryShader::getInputType() == rr::GEOMETRYSHADERINPUTTYPE_TRIANGLES &&
			(mode != GL_TRIANGLES &&
			 mode != GL_TRIANGLE_STRIP &&
			 mode != GL_TRIANGLE_FAN),
			 GL_INVALID_OPERATION, false);

		RC_IF_ERROR(m_currentProgram->m_program->rr::GeometryShader::getInputType() == rr::GEOMETRYSHADERINPUTTYPE_LINES_ADJACENCY &&
			(mode != GL_LINES_ADJACENCY &&
			 mode != GL_LINE_STRIP_ADJACENCY),
			 GL_INVALID_OPERATION, false);

		RC_IF_ERROR(m_currentProgram->m_program->rr::GeometryShader::getInputType() == rr::GEOMETRYSHADERINPUTTYPE_TRIANGLES_ADJACENCY &&
			(mode != GL_TRIANGLES_ADJACENCY &&
			 mode != GL_TRIANGLE_STRIP_ADJACENCY),
			 GL_INVALID_OPERATION, false);
	}

	return true;
}